

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O3

int32_t icu_63::RegexCImpl::appendReplacement
                  (RegularExpression *regexp,UChar *replacementText,int32_t replacementLength,
                  UChar **destBuf,int32_t *destCapacity,UErrorCode *status)

{
  UChar UVar1;
  UErrorCode UVar2;
  bool bVar3;
  RegexMatcher *pRVar4;
  UBool UVar5;
  UErrorCode UVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  UChar *pUVar11;
  UErrorCode UVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  UErrorCode tempStatus;
  uint local_c0;
  uint local_bc;
  ulong local_b8;
  UChar *local_b0;
  UChar *local_a8;
  uint *local_a0;
  RegularExpression *local_98;
  RegexMatcher *local_90;
  int32_t local_84;
  UObject local_80;
  UChar **local_78;
  UnicodeString local_70;
  
  UVar2 = *status;
  bVar17 = destCapacity != (int32_t *)0x0;
  if (bVar17 && UVar2 == U_BUFFER_OVERFLOW_ERROR) {
    if (*destCapacity != 0) {
      return 0;
    }
    *status = U_ZERO_ERROR;
  }
  else if (U_ZERO_ERROR < UVar2) {
    return 0;
  }
  UVar6 = U_ILLEGAL_ARGUMENT_ERROR;
  if ((regexp != (RegularExpression *)0x0) && (regexp->fMagic == 0x72657870)) {
    pUVar11 = regexp->fText;
    if ((pUVar11 != (UChar *)0x0) || (regexp->fOwnsText != '\0')) {
      if ((((destBuf != (UChar **)0x0) && (replacementText != (UChar *)0x0)) &&
          (-2 < replacementLength)) && (destCapacity != (int32_t *)0x0)) {
        local_a8 = *destBuf;
        uVar16 = *destCapacity;
        if (((int)uVar16 < 1 || local_a8 != (UChar *)0x0) && -1 < (int)uVar16) {
          local_90 = regexp->fMatcher;
          if (local_90->fMatch == '\0') {
            *status = U_REGEX_INVALID_STATE;
            return 0;
          }
          local_b8 = (ulong)uVar16;
          local_c0 = replacementLength;
          if (replacementLength == -1) {
            local_c0 = u_strlen_63(replacementText);
            pUVar11 = regexp->fText;
          }
          pRVar4 = local_90;
          local_b0 = replacementText;
          local_98 = regexp;
          local_78 = destBuf;
          if (pUVar11 == (UChar *)0x0) {
            local_70.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)((ulong)local_70.super_Replaceable.super_UObject._vptr_UObject._4_4_ <<
                          0x20);
            uVar16 = utext_extract_63(local_90->fInputText,local_90->fLastMatchEnd,
                                      local_90->fMatchStart,local_a8,(int32_t)local_b8,
                                      (UErrorCode *)&local_70);
          }
          else {
            if (local_90->fInputText->pFuncs->mapNativeIndexToUTF16 ==
                (UTextMapNativeIndexToUTF16 *)0x0) {
              iVar9 = (int)local_90->fMatchStart;
              iVar7 = (int)local_90->fLastMatchEnd;
            }
            else {
              local_70.super_Replaceable.super_UObject._vptr_UObject =
                   (UObject)((ulong)local_70.super_Replaceable.super_UObject._vptr_UObject._4_4_ <<
                            0x20);
              iVar7 = utext_extract_63(local_90->fInputText,0,local_90->fLastMatchEnd,(UChar *)0x0,0
                                       ,(UErrorCode *)&local_70);
              replacementText = local_b0;
              local_70.super_Replaceable.super_UObject._vptr_UObject =
                   (UObject)((ulong)local_70.super_Replaceable.super_UObject._vptr_UObject &
                            0xffffffff00000000);
              iVar8 = utext_extract_63(pRVar4->fInputText,pRVar4->fLastMatchEnd,pRVar4->fMatchStart,
                                       (UChar *)0x0,0,(UErrorCode *)&local_70);
              iVar9 = iVar8 + iVar7;
            }
            uVar10 = iVar9 - iVar7;
            uVar16 = 0;
            if (uVar10 != 0 && iVar7 <= iVar9) {
              uVar13 = 0;
              do {
                if (uVar13 < local_b8) {
                  local_a8[uVar13] = local_98->fText[(long)iVar7 + uVar13];
                }
                uVar13 = uVar13 + 1;
                uVar16 = uVar10;
              } while (uVar10 != uVar13);
            }
          }
          if (0 < (int)local_c0) {
            local_bc = 0;
            local_80._vptr_UObject = (_func_int **)&PTR__UnicodeString_00251160;
            local_a0 = (uint *)destCapacity;
            while (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              UVar1 = replacementText[(int)local_bc];
              uVar10 = local_bc + 1;
              if (UVar1 == L'$') {
                if ((int)uVar10 < (int)local_c0) {
                  UVar1 = replacementText[(int)uVar10];
                  uVar14 = (uint)(ushort)UVar1;
                  if ((((UVar1 & 0xfc00U) == 0xd800) && (local_bc + 2 != local_c0)) &&
                     (((ushort)replacementText[(int)(local_bc + 2)] & 0xfc00) == 0xdc00)) {
                    uVar14 = (uint)(ushort)UVar1 * 0x400 +
                             (uint)(ushort)replacementText[(int)(local_bc + 2)] + 0xfca02400;
                  }
                  local_bc = uVar10;
                  UVar5 = u_isdigit_63(uVar14);
                  if (UVar5 == '\0') {
                    UVar6 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    if (uVar14 != 0x7b) goto LAB_0015cdea;
                    local_70.super_Replaceable.super_UObject._vptr_UObject =
                         (UObject)(UObject)local_80._vptr_UObject;
                    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
                    uVar10 = local_bc + 1;
                    if ((uVar10 != local_c0 && (local_b0[(int)local_bc] & 0xfc00U) == 0xd800) &&
                       ((local_b0[(long)(int)local_bc + 1] & 0xfc00U) == 0xdc00)) {
                      uVar10 = local_bc + 2;
                    }
                    local_bc = uVar10;
                    iVar9 = 0;
                    do {
                      if (U_ZERO_ERROR < *status) break;
                      if ((int)local_c0 <= (int)local_bc) {
LAB_0015cd91:
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                        iVar9 = 0;
                        break;
                      }
                      uVar10 = local_bc + 1;
                      UVar1 = local_b0[(int)local_bc];
                      uVar14 = (uint)(ushort)UVar1;
                      if ((((UVar1 & 0xfc00U) == 0xd800) && (uVar10 != local_c0)) &&
                         (((ushort)local_b0[(long)(int)local_bc + 1] & 0xfc00) == 0xdc00)) {
                        uVar14 = (uint)(ushort)UVar1 * 0x400 +
                                 (uint)(ushort)local_b0[(long)(int)local_bc + 1] + 0xfca02400;
                        uVar10 = local_bc + 2;
                      }
                      local_bc = uVar10;
                      if (uVar14 - 0x31 < 9 || (uVar14 & 0xffffffdf) - 0x41 < 0x1a) {
                        UnicodeString::append(&local_70,uVar14);
                      }
                      else {
                        if (uVar14 == 0x7d) {
                          iVar9 = uhash_geti_63(local_98->fPat->fNamedCaptureMap,&local_70);
                          if (iVar9 == 0) goto LAB_0015cd91;
                          break;
                        }
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                      }
                    } while (uVar14 != 0x7d);
                    UnicodeString::~UnicodeString(&local_70);
                  }
                  else {
LAB_0015cbb8:
                    iVar9 = 0;
                    if ((int)local_bc < (int)local_c0) {
                      local_84 = local_90->fPattern->fGroupMap->count;
                      iVar15 = 0;
                      iVar7 = 0;
                      do {
                        uVar10 = (uint)(ushort)local_b0[(int)local_bc];
                        if ((uVar10 & 0xf800) == 0xd800) {
                          if (((ushort)local_b0[(int)local_bc] >> 10 & 1) == 0) {
                            if ((local_bc + 1 != local_c0) &&
                               (uVar14 = (uint)(ushort)local_b0[(int)(local_bc + 1)],
                               (local_b0[(int)(local_bc + 1)] & 0xfc00U) == 0xdc00)) {
                              uVar10 = uVar10 << 10;
LAB_0015cc5a:
                              uVar10 = uVar10 + uVar14 + 0xfca02400;
                            }
                          }
                          else if ((0 < (int)local_bc) &&
                                  ((local_b0[(ulong)local_bc - 1] & 0xfc00U) == 0xd800)) {
                            uVar14 = (uint)(ushort)local_b0[(ulong)local_bc - 1] << 10;
                            goto LAB_0015cc5a;
                          }
                        }
                        UVar5 = u_isdigit_63(uVar10);
                        destCapacity = (int32_t *)local_a0;
                        iVar9 = iVar7;
                        if (UVar5 == '\0') break;
                        iVar8 = u_charDigitValue_63(uVar10);
                        iVar9 = iVar8 + iVar7 * 10;
                        destCapacity = (int32_t *)local_a0;
                        if (local_84 < iVar9) {
                          iVar9 = iVar7;
                          if (iVar15 == 0) {
                            UVar6 = U_INDEX_OUTOFBOUNDS_ERROR;
                            goto LAB_0015cdea;
                          }
                          break;
                        }
                        uVar10 = local_bc + 1;
                        if ((uVar10 != local_c0 && (local_b0[(int)local_bc] & 0xfc00U) == 0xd800) &&
                           ((local_b0[(long)(int)local_bc + 1] & 0xfc00U) == 0xdc00)) {
                          uVar10 = local_bc + 2;
                        }
                        local_bc = uVar10;
                        iVar15 = iVar15 + -1;
                        iVar7 = iVar9;
                      } while ((int)local_bc < (int)local_c0);
                    }
                  }
                  UVar12 = *status;
                  if (UVar12 < U_ILLEGAL_ARGUMENT_ERROR) {
                    pUVar11 = local_a8 + (int)uVar16;
                    if (local_a8 == (UChar *)0x0) {
                      pUVar11 = (UChar *)0x0;
                    }
                    iVar7 = (int)local_b8 - uVar16;
                    if (iVar7 < 1) {
                      iVar7 = 0;
                    }
                    iVar8 = uregex_group_63((URegularExpression *)local_98,iVar9,pUVar11,iVar7,
                                            status);
                    uVar16 = iVar8 + uVar16;
                    UVar12 = *status;
                    UVar6 = U_ZERO_ERROR;
                    if (UVar12 == U_BUFFER_OVERFLOW_ERROR) goto LAB_0015cdea;
                  }
                }
                else {
                  local_bc = uVar10;
                  UVar5 = u_isdigit_63(-1);
                  if (UVar5 != '\0') goto LAB_0015cbb8;
                  UVar6 = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
LAB_0015cdea:
                  UVar12 = UVar6;
                  *status = UVar12;
                }
                bVar3 = UVar12 < U_ILLEGAL_ARGUMENT_ERROR;
                replacementText = local_b0;
              }
              else {
                if (UVar1 == L'\\') {
                  if ((int)local_c0 <= (int)uVar10) break;
                  UVar1 = replacementText[(int)uVar10];
                  local_bc = uVar10;
                  if (((UVar1 & 0xffdfU) == 0x55) &&
                     (uVar10 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,(int32_t *)&local_bc,
                                               local_c0,replacementText), uVar10 != 0xffffffff)) {
                    if ((int)uVar10 < 0x10000) {
                      if ((int)uVar16 < (int)local_b8) {
                        local_a8[(int)uVar16] = (UChar)uVar10;
                      }
                      goto LAB_0015cb7f;
                    }
                    if ((int)uVar16 < (int)local_b8) {
                      local_a8[(int)uVar16] = (short)(uVar10 >> 10) + L'ퟀ';
                    }
                    if ((int)(uVar16 + 1) < (int)local_b8) {
                      local_a8[(int)(uVar16 + 1)] = (UChar)uVar10 & 0x3ffU | 0xdc00;
                    }
                    uVar16 = uVar16 + 2;
                  }
                  else {
                    if ((int)uVar16 < (int)local_b8) {
                      local_a8[(int)uVar16] = UVar1;
                    }
                    uVar16 = uVar16 + 1;
                    local_bc = local_bc + 1;
                  }
                }
                else {
                  local_bc = uVar10;
                  if ((int)uVar16 < (int)local_b8) {
                    local_a8[(int)uVar16] = UVar1;
                  }
LAB_0015cb7f:
                  uVar16 = uVar16 + 1;
                }
                bVar3 = true;
              }
              if ((!bVar3) || ((int)local_c0 <= (int)local_bc)) break;
            }
          }
          if ((int)uVar16 < (int)local_b8) {
            local_a8[(int)uVar16] = L'\0';
          }
          else if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            if (uVar16 == *destCapacity) {
              *status = U_STRING_NOT_TERMINATED_WARNING;
            }
            else {
              *status = U_BUFFER_OVERFLOW_ERROR;
            }
          }
          if ((0 < (int)uVar16) && (uVar10 = *destCapacity, 0 < (int)uVar10)) {
            if ((int)uVar16 < (int)local_b8) {
              *local_78 = *local_78 + uVar16;
              uVar10 = uVar10 - uVar16;
            }
            else {
              *local_78 = *local_78 + local_b8;
              uVar10 = 0;
            }
            *destCapacity = uVar10;
          }
          if (bVar17 && UVar2 == U_BUFFER_OVERFLOW_ERROR) {
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              *status = U_BUFFER_OVERFLOW_ERROR;
              return uVar16;
            }
            return uVar16;
          }
          return uVar16;
        }
      }
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
    UVar6 = U_REGEX_INVALID_STATE;
  }
  *status = UVar6;
  return 0;
}

Assistant:

int32_t RegexCImpl::appendReplacement(RegularExpression    *regexp,
                                      const UChar           *replacementText,
                                      int32_t                replacementLength,
                                      UChar                **destBuf,
                                      int32_t               *destCapacity,
                                      UErrorCode            *status)  {

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    //
    // Validate all paramters
    //
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;
    if (m->fMatch == FALSE) {
        *status = U_REGEX_INVALID_STATE;
        return 0;
    }

    UChar    *dest             = *destBuf;
    int32_t   capacity         = *destCapacity;
    int32_t   destIdx          =  0;
    int32_t   i;

    // If it wasn't supplied by the caller,  get the length of the replacement text.
    //   TODO:  slightly smarter logic in the copy loop could watch for the NUL on
    //          the fly and avoid this step.
    if (replacementLength == -1) {
        replacementLength = u_strlen(replacementText);
    }

    // Copy input string from the end of previous match to start of current match
    if (regexp->fText != NULL) {
        int32_t matchStart;
        int32_t lastMatchEnd;
        if (UTEXT_USES_U16(m->fInputText)) {
            lastMatchEnd = (int32_t)m->fLastMatchEnd;
            matchStart = (int32_t)m->fMatchStart;
        } else {
            // !!!: Would like a better way to do this!
            UErrorCode tempStatus = U_ZERO_ERROR;
            lastMatchEnd = utext_extract(m->fInputText, 0, m->fLastMatchEnd, NULL, 0, &tempStatus);
            tempStatus = U_ZERO_ERROR;
            matchStart = lastMatchEnd + utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart, NULL, 0, &tempStatus);
        }
        for (i=lastMatchEnd; i<matchStart; i++) {
            appendToBuf(regexp->fText[i], &destIdx, dest, capacity);
        }
    } else {
        UErrorCode possibleOverflowError = U_ZERO_ERROR; // ignore
        destIdx += utext_extract(m->fInputText, m->fLastMatchEnd, m->fMatchStart,
                                 dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity),
                                 &possibleOverflowError);
    }
    U_ASSERT(destIdx >= 0);

    // scan the replacement text, looking for substitutions ($n) and \escapes.
    int32_t  replIdx = 0;
    while (replIdx < replacementLength && U_SUCCESS(*status)) {
        UChar  c = replacementText[replIdx];
        replIdx++;
        if (c != DOLLARSIGN && c != BACKSLASH) {
            // Common case, no substitution, no escaping,
            //  just copy the char to the dest buf.
            appendToBuf(c, &destIdx, dest, capacity);
            continue;
        }

        if (c == BACKSLASH) {
            // Backslash Escape.  Copy the following char out without further checks.
            //                    Note:  Surrogate pairs don't need any special handling
            //                           The second half wont be a '$' or a '\', and
            //                           will move to the dest normally on the next
            //                           loop iteration.
            if (replIdx >= replacementLength) {
                break;
            }
            c = replacementText[replIdx];

            if (c==0x55/*U*/ || c==0x75/*u*/) {
                // We have a \udddd or \Udddddddd escape sequence.
                UChar32 escapedChar =
                    u_unescapeAt(uregex_ucstr_unescape_charAt,
                       &replIdx,                   // Index is updated by unescapeAt
                       replacementLength,          // Length of replacement text
                       (void *)replacementText);

                if (escapedChar != (UChar32)0xFFFFFFFF) {
                    if (escapedChar <= 0xffff) {
                        appendToBuf((UChar)escapedChar, &destIdx, dest, capacity);
                    } else {
                        appendToBuf(U16_LEAD(escapedChar), &destIdx, dest, capacity);
                        appendToBuf(U16_TRAIL(escapedChar), &destIdx, dest, capacity);
                    }
                    continue;
                }
                // Note:  if the \u escape was invalid, just fall through and
                //        treat it as a plain \<anything> escape.
            }

            // Plain backslash escape.  Just put out the escaped character.
            appendToBuf(c, &destIdx, dest, capacity);

            replIdx++;
            continue;
        }

        // We've got a $.  Pick up the following capture group name or number.
        // For numbers, consume only digits that produce a valid capture group for the pattern.

        int32_t groupNum  = 0;
        U_ASSERT(c == DOLLARSIGN);
        UChar32 c32 = -1;
        if (replIdx < replacementLength) {
            U16_GET(replacementText, 0, replIdx, replacementLength, c32);
        }
        if (u_isdigit(c32)) {
            int32_t numDigits = 0;
            int32_t numCaptureGroups = m->fPattern->fGroupMap->size();
            for (;;) {
                if (replIdx >= replacementLength) {
                    break;
                }
                U16_GET(replacementText, 0, replIdx, replacementLength, c32);
                if (u_isdigit(c32) == FALSE) {
                    break;
                }

                int32_t digitVal = u_charDigitValue(c32);
                if (groupNum * 10 + digitVal <= numCaptureGroups) {
                    groupNum = groupNum * 10 + digitVal;
                    U16_FWD_1(replacementText, replIdx, replacementLength);
                    numDigits++;
                } else {
                    if (numDigits == 0) {
                        *status = U_INDEX_OUTOFBOUNDS_ERROR;
                    }
                    break;
                }
            }
        } else if (c32 == LEFTBRACKET) {
            // Scan for Named Capture Group, ${name}.
            UnicodeString groupName;
            U16_FWD_1(replacementText, replIdx, replacementLength);
            while (U_SUCCESS(*status) && c32 != RIGHTBRACKET) { 
                if (replIdx >= replacementLength) {
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    break;
                }
                U16_NEXT(replacementText, replIdx, replacementLength, c32);
                if ((c32 >= 0x41 && c32 <= 0x5a) ||           // A..Z
                        (c32 >= 0x61 && c32 <= 0x7a) ||       // a..z
                        (c32 >= 0x31 && c32 <= 0x39)) {       // 0..9
                    groupName.append(c32);
                } else if (c32 == RIGHTBRACKET) {
                    groupNum = uhash_geti(regexp->fPat->fNamedCaptureMap, &groupName);
                    if (groupNum == 0) {
                        // Name not defined by pattern.
                        *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                    }
                } else {
                    // Character was something other than a name char or a closing '}'
                    *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
                }
            }
        } else {
            // $ not followed by {name} or digits.
            *status = U_REGEX_INVALID_CAPTURE_GROUP_NAME;
        }


        // Finally, append the capture group data to the destination.
        if (U_SUCCESS(*status)) {
            destIdx += uregex_group((URegularExpression*)regexp, groupNum,
                                    dest==NULL?NULL:&dest[destIdx], REMAINING_CAPACITY(destIdx, capacity), status);
            if (*status == U_BUFFER_OVERFLOW_ERROR) {
                // Ignore buffer overflow when extracting the group.  We need to
                //   continue on to get full size of the untruncated result.  We will
                //   raise our own buffer overflow error at the end.
                *status = U_ZERO_ERROR;
            }
        }

        if (U_FAILURE(*status)) {
            // bad group number or name.
            break;
        }
    }

    //
    //  Nul Terminate the dest buffer if possible.
    //  Set the appropriate buffer overflow or not terminated error, if needed.
    //
    if (destIdx < capacity) {
        dest[destIdx] = 0;
    } else if (U_SUCCESS(*status)) {
        if (destIdx == *destCapacity) {
            *status = U_STRING_NOT_TERMINATED_WARNING;
        } else {
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
    }

    //
    // Return an updated dest buffer and capacity to the caller.
    //
    if (destIdx > 0 &&  *destCapacity > 0) {
        if (destIdx < capacity) {
            *destBuf      += destIdx;
            *destCapacity -= destIdx;
        } else {
            *destBuf      += capacity;
            *destCapacity =  0;
        }
    }

    // If we came in with a buffer overflow, make sure we go out with one also.
    //   (A zero length match right at the end of the previous match could
    //    make this function succeed even though a previous call had overflowed the buf)
    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}